

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

QMainWindowTabBar * __thiscall
QMainWindowLayout::findTabBar(QMainWindowLayout *this,QDockWidget *dockWidget)

{
  Span *pSVar1;
  bool bVar2;
  ulong uVar3;
  QMainWindowTabBar *tabBar;
  QMainWindowTabBar *this_00;
  long in_FS_OFFSET;
  piter local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = (piter)QHash<QTabBar_*,_QHashDummyValue>::begin
                              ((QHash<QTabBar_*,_QHashDummyValue> *)(this + 0x718));
  while( true ) {
    if (local_30.d == (Data<QHashPrivate::Node<QTabBar_*,_QHashDummyValue>_> *)0x0 &&
        local_30.bucket == 0) break;
    pSVar1 = (local_30.d)->spans;
    uVar3 = local_30.bucket >> 7;
    this_00 = *(QMainWindowTabBar **)
               pSVar1[uVar3].entries[pSVar1[uVar3].offsets[(uint)local_30.bucket & 0x7f]].storage.
               data;
    bVar2 = QMainWindowTabBar::contains((QMainWindowTabBar *)this_00,dockWidget);
    if (bVar2) goto LAB_00402069;
    QHashPrivate::iterator<QHashPrivate::Node<QTabBar_*,_QHashDummyValue>_>::operator++(&local_30);
  }
  this_00 = (QMainWindowTabBar *)0x0;
LAB_00402069:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QMainWindowTabBar *QMainWindowLayout::findTabBar(const QDockWidget *dockWidget) const
{
     for (auto *bar : usedTabBars) {
        Q_ASSERT(qobject_cast<QMainWindowTabBar *>(bar));
        auto *tabBar = static_cast<QMainWindowTabBar *>(bar);
        if (tabBar->contains(dockWidget))
            return tabBar;
    }
    return nullptr;
}